

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O2

string_view __thiscall wabt::GetExtension(wabt *this,string_view filename)

{
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  string_view filename_local;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  __pos = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&filename_local,'.',0xffffffffffffffff);
  if (__pos == 0xffffffffffffffff) {
    bVar1 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x161801) << 0x40);
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&filename_local,__pos,0xffffffffffffffff);
  }
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

std::string_view GetExtension(std::string_view filename) {
  size_t pos = filename.find_last_of('.');
  if (pos == std::string_view::npos) {
    return "";
  }
  return filename.substr(pos);
}